

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

Integer gai_correct_strided_patch(Integer ndim,Integer *lo,Integer *skip,Integer *plo,Integer *phi)

{
  long lVar1;
  long lVar2;
  
  if (0 < ndim) {
    lVar2 = 0;
    do {
      lVar1 = (plo[lVar2] - lo[lVar2]) % skip[lVar2];
      if (lVar1 != 0) {
        plo[lVar2] = (skip[lVar2] + plo[lVar2]) - lVar1;
      }
      lVar1 = (phi[lVar2] - lo[lVar2]) % skip[lVar2];
      if (lVar1 != 0) {
        phi[lVar2] = phi[lVar2] - lVar1;
      }
      if (phi[lVar2] < plo[lVar2]) {
        return 0;
      }
      lVar2 = lVar2 + 1;
    } while (ndim != lVar2);
  }
  return 1;
}

Assistant:

Integer gai_correct_strided_patch(Integer ndim,
                                  Integer *lo,
                                  Integer *skip,
                                  Integer *plo,
                                  Integer *phi)
{
  Integer i, delta;
  for (i=0; i<ndim; i++) {
    delta = plo[i]-lo[i];
    if (delta%skip[i] != 0) {
      plo[i] = plo[i] - delta%skip[i] + skip[i];
    }
    delta = phi[i]-lo[i];
    if (delta%skip[i] != 0) {
      phi[i] = phi[i] - delta%skip[i];
    }
    if (phi[i]<plo[i]) return 0;
  }
  return 1;
}